

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

String * doctest::detail::
         stringifyBinaryExpr<__gnu_cxx::__normal_iterator<cinatra::http_header*,std::span<cinatra::http_header,18446744073709551615ul>>,__gnu_cxx::__normal_iterator<cinatra::http_header*,std::span<cinatra::http_header,18446744073709551615ul>>>
                   (__normal_iterator<cinatra::http_header_*,_std::span<cinatra::http_header,_18446744073709551615UL>_>
                    *lhs,char *op,
                   __normal_iterator<cinatra::http_header_*,_std::span<cinatra::http_header,_18446744073709551615UL>_>
                   *rhs)

{
  String *in_RDI;
  __normal_iterator<cinatra::http_header_*,_std::span<cinatra::http_header,_18446744073709551615UL>_>
  *in_stack_ffffffffffffff58;
  String *in_stack_ffffffffffffff70;
  String *in_stack_ffffffffffffffa0;
  String *in_stack_ffffffffffffffa8;
  
  toString<__gnu_cxx::__normal_iterator<cinatra::http_header_*,_std::span<cinatra::http_header,_18446744073709551615UL>_>,_true>
            (in_stack_ffffffffffffff58);
  String::String(in_stack_ffffffffffffff70,(char *)in_RDI);
  doctest::operator+(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  toString<__gnu_cxx::__normal_iterator<cinatra::http_header_*,_std::span<cinatra::http_header,_18446744073709551615UL>_>,_true>
            (in_stack_ffffffffffffff58);
  doctest::operator+(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  String::~String(in_stack_ffffffffffffff70);
  String::~String(in_stack_ffffffffffffff70);
  String::~String(in_stack_ffffffffffffff70);
  String::~String(in_stack_ffffffffffffff70);
  return in_RDI;
}

Assistant:

String stringifyBinaryExpr(const DOCTEST_REF_WRAP(L) lhs, const char* op,
                                   const DOCTEST_REF_WRAP(R) rhs) {
            // NOLINTNEXTLINE(clang-analyzer-cplusplus.NewDeleteLeaks)
            return toString(lhs) + op + toString(rhs);
        }